

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3LockAndPrepare
              (sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pOld,sqlite3_stmt **ppStmt,
              char **pzTail)

{
  u8 uVar1;
  Btree *pBVar2;
  sqlite3 *db_00;
  Vdbe *pVVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  TriggerPrg *p;
  int *piVar8;
  size_t __n;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  char *zErrMsg;
  int cookie;
  TriggerPrg *local_210;
  u32 local_204;
  ulong local_200;
  ulong local_1f8;
  sqlite3 *local_1f0;
  char *local_1e8;
  u64 local_1e0;
  sqlite3_stmt **local_1d8;
  Vdbe *local_1d0;
  Parse local_1c8;
  
  *ppStmt = (sqlite3_stmt *)0x0;
  local_1d8 = ppStmt;
  local_1d0 = pOld;
  iVar4 = sqlite3SafetyCheckOk(db);
  if ((zSql == (char *)0x0) || (iVar4 == 0)) {
    uVar5 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1e012,
                "fb90e7189ae6d62e77ba3a308ca5d683f90bbe633cf681865365b8e92792d1c7");
  }
  else {
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    local_1f8 = (ulong)(uint)nBytes;
    local_1e0 = local_1f8 + 1;
    local_1e8 = zSql + local_1f8;
    local_200 = 0;
    local_1f0 = db;
    do {
      do {
        local_210 = (TriggerPrg *)0x0;
        memset(&local_1c8,0,0xc4);
        memset(&local_1c8.sLastToken,0,0xa0);
        local_1c8.pReprepare = local_1d0;
        if ((prepFlags & 1) != 0) {
          local_1c8.disableLookaside = local_1c8.disableLookaside + '\x01';
          (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
        }
        if (db->nDb < 1) {
          uVar5 = 0;
        }
        else {
          lVar9 = 0;
          lVar7 = 0;
          uVar5 = 0;
          do {
            pBVar2 = *(Btree **)((long)&db->aDb->pBt + lVar9);
            iVar4 = 0;
            if (pBVar2 != (Btree *)0x0) {
              if ((pBVar2->sharable != '\0') &&
                 (pBVar2->wantToLock = pBVar2->wantToLock + 1, pBVar2->locked == '\0')) {
                btreeLockCarefully(pBVar2);
              }
              uVar5 = querySharedCacheTableLock(pBVar2,1,'\x01');
              if (pBVar2->sharable != '\0') {
                piVar8 = &pBVar2->wantToLock;
                *piVar8 = *piVar8 + -1;
                if (*piVar8 == 0) {
                  unlockBtreeMutex(pBVar2);
                }
              }
              if (uVar5 == 0) {
                iVar4 = 0;
                uVar5 = 0;
              }
              else {
                sqlite3ErrorWithMsg(db,uVar5,"database schema is locked: %s",
                                    *(undefined8 *)((long)&db->aDb->zDbSName + lVar9));
                iVar4 = 5;
              }
            }
            if (iVar4 != 0) {
              if (iVar4 != 5) goto LAB_001378fe;
              goto LAB_001378f6;
            }
            lVar7 = lVar7 + 1;
            lVar9 = lVar9 + 0x20;
          } while (lVar7 < db->nDb);
        }
        sqlite3VtabUnlockList(db);
        local_1c8.db = db;
        if ((nBytes < 0) || ((nBytes != 0 && (zSql[local_1f8 - 1] == '\0')))) {
          sqlite3RunParser(&local_1c8,zSql,(char **)&local_210);
LAB_00137609:
          db_00 = local_1c8.db;
          if (local_1c8.rc == 0x65) {
            local_1c8.rc = 0;
          }
          if ((local_1c8.checkSchema != '\0') && (db = local_1f0, 0 < (local_1c8.db)->nDb)) {
            lVar7 = 0;
            lVar9 = 0;
            do {
              pBVar2 = *(Btree **)((long)&db_00->aDb->pBt + lVar7);
              if (pBVar2 == (Btree *)0x0) {
                bVar11 = false;
              }
              else {
                uVar1 = pBVar2->inTrans;
                if ((uVar1 == '\0') &&
                   (iVar4 = sqlite3BtreeBeginTrans(pBVar2,0,(int *)0x0), iVar4 != 0)) {
                  bVar11 = true;
                  if ((iVar4 == 0xc0a) || (iVar4 == 7)) {
                    if ((db_00->mallocFailed == '\0') && (db_00->bBenignMalloc == '\0')) {
                      db_00->mallocFailed = '\x01';
                      if (0 < db_00->nVdbeExec) {
                        (db_00->u1).isInterrupted = 1;
                      }
                      (db_00->lookaside).bDisable = (db_00->lookaside).bDisable + 1;
                    }
                    if (iVar4 == 0) goto LAB_0013764f;
                  }
                }
                else {
LAB_0013764f:
                  sqlite3BtreeGetMeta(pBVar2,1,&local_204);
                  if (local_204 != **(u32 **)((long)&db_00->aDb->pSchema + lVar7)) {
                    sqlite3ResetOneSchema(db_00,(int)lVar9);
                    local_1c8.rc = 0x11;
                  }
                  bVar11 = false;
                  if (uVar1 == '\0') {
                    sqlite3BtreeCommit(pBVar2);
                  }
                }
              }
              db = local_1f0;
              if (bVar11) break;
              lVar9 = lVar9 + 1;
              lVar7 = lVar7 + 0x20;
            } while (lVar9 < db_00->nDb);
          }
          if (db->mallocFailed != '\0') {
            local_1c8.rc = 7;
          }
          uVar5 = local_1c8.rc;
          if (pzTail != (char **)0x0) {
            *pzTail = local_1c8.zTail;
          }
          if ((local_1c8.explain != '\0' && local_1c8.pVdbe != (Vdbe *)0x0) && local_1c8.rc == 0) {
            bVar11 = local_1c8.explain == '\x02';
            uVar10 = (ulong)((uint)bVar11 * 8);
            sqlite3VdbeSetNumCols(local_1c8.pVdbe,(uint)!bVar11 * 4 + 4);
            piVar8 = (int *)(sqlite3Prepare_azColName_rel + (ulong)bVar11 * 0x20);
            lVar7 = 0;
            do {
              if ((local_1c8.pVdbe)->db->mallocFailed == '\0') {
                sqlite3VdbeMemSetStr
                          ((Mem *)((long)&(local_1c8.pVdbe)->aColName->u + lVar7),
                           sqlite3Prepare_azColName_rel + *piVar8,-1,'\x01',
                           (_func_void_void_ptr *)0x0);
              }
              uVar10 = uVar10 + 1;
              piVar8 = piVar8 + 1;
              lVar7 = lVar7 + 0x38;
            } while (uVar10 < (ulong)bVar11 * 4 + 8);
          }
          pVVar3 = local_1c8.pVdbe;
          db = local_1f0;
          if (((local_1f0->init).busy == '\0') && (local_1c8.pVdbe != (Vdbe *)0x0)) {
            (local_1c8.pVdbe)->prepFlags = (u8)prepFlags;
            if (-1 < (char)(u8)prepFlags) {
              (local_1c8.pVdbe)->expmask = 0;
            }
            __n = (size_t)((int)local_1c8.zTail - (int)zSql);
            pcVar6 = (char *)sqlite3DbMallocRawNN((local_1c8.pVdbe)->db,__n + 1);
            if (pcVar6 != (char *)0x0) {
              memcpy(pcVar6,zSql,__n);
              pcVar6[__n] = '\0';
            }
            pVVar3->zSql = pcVar6;
          }
          if ((local_1c8.pVdbe == (Vdbe *)0x0) || ((uVar5 == 0 && (db->mallocFailed == '\0')))) {
            *local_1d8 = (sqlite3_stmt *)local_1c8.pVdbe;
          }
          else {
            sqlite3VdbeFinalize(local_1c8.pVdbe);
          }
          p = local_210;
          if (local_210 == (TriggerPrg *)0x0) {
            db->errCode = uVar5;
            if ((uVar5 == 0) && (db->pErr == (sqlite3_value *)0x0)) goto LAB_001378d3;
            sqlite3ErrorFinish(db,uVar5);
            goto LAB_001378d3;
          }
          sqlite3ErrorWithMsg(db,uVar5,"%s",local_210);
          while( true ) {
            sqlite3DbFreeNN(db,p);
LAB_001378d3:
            if (local_1c8.pTriggerPrg == (TriggerPrg *)0x0) break;
            p = local_1c8.pTriggerPrg;
            local_1c8.pTriggerPrg = (local_1c8.pTriggerPrg)->pNext;
          }
LAB_001378f6:
          sqlite3ParserReset(&local_1c8);
        }
        else {
          if (db->aLimit[1] < nBytes) {
            sqlite3ErrorWithMsg(db,0x12,"statement too long");
            if (db->mallocFailed == '\0') {
              uVar5 = db->errMask & 0x12;
            }
            else {
              apiOomError(db);
              uVar5 = 7;
            }
            iVar4 = 5;
          }
          else {
            pcVar6 = (char *)sqlite3DbMallocRawNN(db,local_1e0);
            uVar10 = local_1f8;
            if (pcVar6 == (char *)0x0) {
              local_1c8.zTail = local_1e8;
            }
            else {
              memcpy(pcVar6,zSql,local_1f8);
              pcVar6[uVar10] = '\0';
              sqlite3RunParser(&local_1c8,pcVar6,(char **)&local_210);
              local_1c8.zTail = zSql + ((long)local_1c8.zTail - (long)pcVar6);
              sqlite3DbFreeNN(db,pcVar6);
            }
            iVar4 = 0;
          }
          if (iVar4 == 0) goto LAB_00137609;
          if (iVar4 == 5) goto LAB_001378f6;
        }
LAB_001378fe:
      } while (uVar5 == 0x201);
      if (uVar5 != 0x11) break;
      sqlite3ResetOneSchema(db,-1);
      iVar4 = (int)local_200;
      local_200 = (ulong)(iVar4 + 1);
    } while (iVar4 == 0);
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    if ((uVar5 == 0xc0a) || (db->mallocFailed != '\0')) {
      apiOomError(db);
      uVar5 = 7;
    }
    else {
      uVar5 = uVar5 & db->errMask;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return uVar5;
}

Assistant:

static int sqlite3LockAndPrepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pOld,               /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  int cnt = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  do{
    /* Make multiple attempts to compile the SQL, until it either succeeds
    ** or encounters a permanent error.  A schema problem after one schema
    ** reset is considered a permanent error. */
    rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
    assert( rc==SQLITE_OK || *ppStmt==0 );
  }while( rc==SQLITE_ERROR_RETRY
       || (rc==SQLITE_SCHEMA && (sqlite3ResetOneSchema(db,-1), cnt++)==0) );
  sqlite3BtreeLeaveAll(db);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}